

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O3

GPU_RendererID * GPU_GetRendererID(GPU_RendererID *__return_storage_ptr__,GPU_RendererEnum renderer)

{
  undefined8 uVar1;
  long lVar2;
  
  gpu_init_renderer_register();
  lVar2 = 8;
  do {
    if (*(GPU_RendererEnum *)((long)&_gpu_renderer_register[0].id.name + lVar2) == renderer) {
      *(undefined8 *)&__return_storage_ptr__->minor_version =
           *(undefined8 *)((long)&_gpu_renderer_register[0].id.renderer + lVar2);
      uVar1 = *(undefined8 *)((long)&_gpu_renderer_register[0].id.name + lVar2);
      __return_storage_ptr__->name = *(char **)((long)_gpu_renderer_map + lVar2 + 0x98);
      __return_storage_ptr__->renderer = (int)uVar1;
      __return_storage_ptr__->major_version = (int)((ulong)uVar1 >> 0x20);
      return __return_storage_ptr__;
    }
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0x198);
  GPU_MakeRendererID(__return_storage_ptr__,"Unknown",0,0,0);
  return __return_storage_ptr__;
}

Assistant:

GPU_RendererID GPU_GetRendererID(GPU_RendererEnum renderer)
{
	int i;

	gpu_init_renderer_register();

	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		if(_gpu_renderer_register[i].id.renderer == renderer)
			return _gpu_renderer_register[i].id;
	}
	
	return GPU_MakeRendererID("Unknown", GPU_RENDERER_UNKNOWN, 0, 0);
}